

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

void high_pass_filter(vector<float,_std::allocator<float>_> *data,float cutoff,float sample_rate)

{
  float fVar1;
  reference pvVar2;
  size_type sVar3;
  vector<float,_std::allocator<float>_> *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  size_t i;
  float y;
  float alpha;
  float dt;
  float rc;
  undefined8 local_28;
  undefined4 local_20;
  
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,0);
  local_20 = *pvVar2;
  local_28 = 1;
  while( true ) {
    sVar3 = std::vector<float,_std::allocator<float>_>::size(in_RDI);
    if (sVar3 <= local_28) break;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_28);
    fVar1 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_28 - 1);
    local_20 = ((1.0 / in_XMM1_Da) / (1.0 / (in_XMM0_Da * 6.2831855) + 1.0 / in_XMM1_Da)) *
               ((local_20 + fVar1) - *pvVar2);
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,local_28);
    *pvVar2 = local_20;
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void high_pass_filter(std::vector<float> & data, float cutoff, float sample_rate) {
    const float rc = 1.0f / (2.0f * M_PI * cutoff);
    const float dt = 1.0f / sample_rate;
    const float alpha = dt / (rc + dt);

    float y = data[0];

    for (size_t i = 1; i < data.size(); i++) {
        y = alpha * (y + data[i] - data[i - 1]);
        data[i] = y;
    }
}